

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::TryOptimizeInstrWithFixedDataProperty(GlobOpt *this,Instr **pInstr)

{
  SymOpnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  
  if (pInstr == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xe74,"(pInstr)","pInstr");
    if (!bVar2) goto LAB_004511ea;
    *puVar4 = 0;
  }
  this_00 = (SymOpnd *)(*pInstr)->m_src1;
  if (this_00 != (SymOpnd *)0x0) {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 == OpndKindSym) {
      OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar2) goto LAB_004511ea;
        *puVar4 = 0;
      }
      bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00);
      if (bVar2) goto LAB_00451156;
    }
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0xe77,"(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd())",
                     "src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd()");
  if (!bVar2) {
LAB_004511ea:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00451156:
  this_01 = JITTimeWorkItem::GetJITFunctionBody((*pInstr)->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo((*pInstr)->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,UseFixedDataPropsPhase,sourceContextId,functionId);
  if (((!bVar2) && (this->prePassLoop == (Loop *)0x0)) && ((this->field_0xf4 & 0x20) == 0)) {
    bVar2 = OpCodeAttr::CanLoadFixedFields((*pInstr)->m_opcode);
    if (bVar2) {
      IR::Instr::TryOptimizeInstrWithFixedDataProperty(*pInstr,pInstr,this);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::TryOptimizeInstrWithFixedDataProperty(IR::Instr ** const pInstr)
{
    Assert(pInstr);
    IR::Instr * &instr = *pInstr;
    IR::Opnd * src1 = instr->GetSrc1();
    Assert(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd());

    if(PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func))
    {
        return;
    }

    if (!this->IsLoopPrePass() && !this->isRecursiveCallOnLandingPad &&
        OpCodeAttr::CanLoadFixedFields(instr->m_opcode))
    {
        instr->TryOptimizeInstrWithFixedDataProperty(&instr, this);
    }
}